

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O0

bool dxil_spv::analyze_ags_wmma_store(Impl *impl,StoreInst *store)

{
  Id IVar1;
  undefined8 uVar2;
  uint32_t uVar3;
  bool bVar4;
  uint uVar5;
  Value *pVVar6;
  GetElementPtrInst *this;
  void *pvVar7;
  mapped_type *pmVar8;
  pointer ppVar9;
  LoggingCallback p_Var10;
  char local_50a8 [8];
  char buffer_4 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_4;
  char buffer_3 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_3;
  char buffer_2 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_2;
  mapped_type *tracking;
  SplitScaleBias split;
  Value *index;
  char buffer_1 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_1;
  AllocaInst *alloca;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  GetElementPtrInst *gep;
  Value *local_30;
  _Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
  local_28;
  iterator itr;
  StoreInst *store_local;
  Impl *impl_local;
  
  itr.
  super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
             )(_Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
               )store;
  local_30 = LLVMBC::Instruction::getOperand(&store->super_Instruction,0);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::AGSCoopMatMapping,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>_>
       ::find(&(impl->ags).coopmat_component_mapping,&local_30);
  gep = (GetElementPtrInst *)
        std::
        unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::AGSCoopMatMapping,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>_>
        ::end(&(impl->ags).coopmat_component_mapping);
  bVar4 = std::__detail::operator==
                    (&local_28,
                     (_Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
                      *)&gep);
  if (bVar4) {
    impl_local._7_1_ = true;
  }
  else {
    pVVar6 = LLVMBC::Instruction::getOperand
                       ((Instruction *)
                        itr.
                        super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
                        ._M_cur,1);
    this = LLVMBC::dyn_cast<LLVMBC::GetElementPtrInst>(pVVar6);
    if (this == (GetElementPtrInst *)0x0) {
      buffer._4088_8_ = get_thread_log_callback();
      if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
        fprintf(_stderr,"[ERROR]: Trying to store a WMMA matrix without GEP.\n");
        fflush(_stderr);
      }
      else {
        snprintf((char *)&alloca,0x1000,"Trying to store a WMMA matrix without GEP.\n");
        uVar2 = buffer._4088_8_;
        pvVar7 = get_thread_log_callback_userdata();
        (*(code *)uVar2)(pvVar7,2,&alloca);
      }
      impl_local._7_1_ = false;
    }
    else {
      pVVar6 = LLVMBC::Instruction::getOperand(&this->super_Instruction,0);
      cb_1 = (_func_void_void_ptr_LogLevel_char_ptr *)LLVMBC::dyn_cast<LLVMBC::AllocaInst>(pVVar6);
      if (((AllocaInst *)cb_1 == (AllocaInst *)0x0) ||
         (uVar5 = LLVMBC::Instruction::getNumOperands(&this->super_Instruction), uVar5 < 3)) {
        buffer_1._4088_8_ = get_thread_log_callback();
        if ((LoggingCallback)buffer_1._4088_8_ == (LoggingCallback)0x0) {
          fprintf(_stderr,"[ERROR]: Trying to store WMMA to something not Alloca.\n");
          fflush(_stderr);
        }
        else {
          snprintf((char *)&index,0x1000,"Trying to store WMMA to something not Alloca.\n");
          uVar2 = buffer_1._4088_8_;
          pvVar7 = get_thread_log_callback_userdata();
          (*(code *)uVar2)(pvVar7,2,&index);
        }
        impl_local._7_1_ = false;
      }
      else {
        split._16_8_ = LLVMBC::Instruction::getOperand(&this->super_Instruction,2);
        split_index_scale_bias((SplitScaleBias *)&tracking,(Value *)split._16_8_);
        if ((uint)tracking == 0) {
          impl_local._7_1_ = false;
        }
        else {
          pmVar8 = std::
                   unordered_map<const_LLVMBC::AllocaInst_*,_dxil_spv::AllocaAGSForwardingTracking,_std::hash<const_LLVMBC::AllocaInst_*>,_std::equal_to<const_LLVMBC::AllocaInst_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaAGSForwardingTracking>_>_>
                   ::operator[](&impl->alloca_ags_tracking,(key_type *)&cb_1);
          if (((pmVar8->override_element_stride == 0) ||
              (pmVar8->override_element_stride == (uint)tracking)) || ((uint)tracking == 0xffffffff)
             ) {
            if ((pmVar8->override_element_type == 0) ||
               (IVar1 = pmVar8->override_element_type,
               ppVar9 = std::__detail::
                        _Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false,_false>
                        ::operator->((_Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false,_false>
                                      *)&local_28), IVar1 == (ppVar9->second).type_id)) {
              if (((uint)tracking == 0xffffffff) &&
                 (pmVar8->override_element_stride = 8, pmVar8->override_element_stride != 0)) {
                tracking._0_4_ = pmVar8->override_element_stride;
                split.index._0_4_ = (uint)split.index % (uint)tracking;
              }
              uVar3 = (uint)split.index;
              ppVar9 = std::__detail::
                       _Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false,_false>
                       ::operator->((_Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false,_false>
                                     *)&local_28);
              if (uVar3 == (ppVar9->second).component) {
                if ((uint)tracking != 0xffffffff) {
                  pmVar8->override_element_stride = (uint)tracking;
                }
                ppVar9 = std::__detail::
                         _Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false,_false>
                         ::operator->((_Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false,_false>
                                       *)&local_28);
                pmVar8->override_element_type = (ppVar9->second).type_id;
                impl_local._7_1_ = true;
              }
              else {
                p_Var10 = get_thread_log_callback();
                if (p_Var10 == (LoggingCallback)0x0) {
                  fprintf(_stderr,"[ERROR]: Unexpected component mapping in WMMA store.\n");
                  fflush(_stderr);
                }
                else {
                  snprintf(local_50a8,0x1000,"Unexpected component mapping in WMMA store.\n");
                  pvVar7 = get_thread_log_callback_userdata();
                  (*p_Var10)(pvVar7,Error,local_50a8);
                }
                impl_local._7_1_ = false;
              }
            }
            else {
              p_Var10 = get_thread_log_callback();
              if (p_Var10 == (LoggingCallback)0x0) {
                fprintf(_stderr,"[ERROR]: Mismatch WMMA type.\n");
                fflush(_stderr);
              }
              else {
                snprintf((char *)&cb_4,0x1000,"Mismatch WMMA type.\n");
                pvVar7 = get_thread_log_callback_userdata();
                (*p_Var10)(pvVar7,Error,(char *)&cb_4);
              }
              impl_local._7_1_ = false;
            }
          }
          else {
            buffer_2._4088_8_ = get_thread_log_callback();
            if ((LoggingCallback)buffer_2._4088_8_ == (LoggingCallback)0x0) {
              fprintf(_stderr,"[ERROR]: Mismatch WMMA stride.\n");
              fflush(_stderr);
            }
            else {
              snprintf((char *)&cb_3,0x1000,"Mismatch WMMA stride.\n");
              uVar2 = buffer_2._4088_8_;
              pvVar7 = get_thread_log_callback_userdata();
              (*(code *)uVar2)(pvVar7,2,&cb_3);
            }
            impl_local._7_1_ = false;
          }
        }
      }
    }
  }
  return impl_local._7_1_;
}

Assistant:

bool analyze_ags_wmma_store(Converter::Impl &impl, const llvm::StoreInst *store)
{
	auto itr = impl.ags.coopmat_component_mapping.find(store->getOperand(0));
	if (itr == impl.ags.coopmat_component_mapping.end())
		return true;

	const auto *gep = llvm::dyn_cast<llvm::GetElementPtrInst>(store->getOperand(1));
	if (!gep)
	{
		LOGE("Trying to store a WMMA matrix without GEP.\n");
		return false;
	}

	auto *alloca = llvm::dyn_cast<llvm::AllocaInst>(gep->getOperand(0));
	if (!alloca || gep->getNumOperands() < 3)
	{
		LOGE("Trying to store WMMA to something not Alloca.\n");
		return false;
	}

	const auto *index = gep->getOperand(2);
	auto split = split_index_scale_bias(index);
	if (!split.stride)
		return false;

	auto &tracking = impl.alloca_ags_tracking[alloca];
	if (tracking.override_element_stride &&
	    tracking.override_element_stride != split.stride &&
	    split.stride != UINT32_MAX)
	{
		LOGE("Mismatch WMMA stride.\n");
		return false;
	}

	if (tracking.override_element_type && tracking.override_element_type != itr->second.type_id)
	{
		LOGE("Mismatch WMMA type.\n");
		return false;
	}

	if (split.stride == UINT32_MAX)
	{
		// Somewhat hacky, but this is the AGS assumption.
		tracking.override_element_stride = 8;

#if 0
		// This breaks in some cases.
		if (split.elem > itr->second.component)
		{
			if (tracking.override_element_stride == 0)
			{
				// We can deduce stride from this.
				tracking.override_element_stride = split.elem - itr->second.component;
			}
			else
			{
				// This isn't perfect if there are gaps in the writes, but we can assume that's not the case.
				tracking.override_element_stride =
					std::min<uint32_t>(split.elem - itr->second.component,
									   tracking.override_element_stride);
			}
		}
#endif
	}

	if (split.stride == UINT32_MAX && tracking.override_element_stride)
	{
		split.stride = tracking.override_element_stride;
		split.elem %= split.stride;
	}

	// If we have constant indices we don't know how the mapping works yet.
	if (split.elem != itr->second.component)
	{
		LOGE("Unexpected component mapping in WMMA store.\n");
		return false;
	}

	if (split.stride != UINT32_MAX)
		tracking.override_element_stride = split.stride;
	tracking.override_element_type = itr->second.type_id;
	return true;
}